

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *field)

{
  TypeModuleField *pTVar1;
  tuple<wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_> tVar2;
  _Head_base<0UL,_wabt::TypeModuleField_*,_false> local_50;
  _Head_base<0UL,_wabt::TypeEntry_*,_false> local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pTVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
           .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl;
  tVar2.super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
  super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_> *)
        &(pTVar1->type)._M_t.
         super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>;
  if (*(long *)((long)tVar2.
                      super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>
                      .super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl + 0x30) != 0) {
    local_48._M_head_impl =
         (TypeEntry *)
         (pTVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.filename.
         _M_len;
    uStack_40 = *(undefined4 *)
                 &(pTVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.
                  filename._M_str;
    uStack_3c = *(undefined4 *)
                 ((long)&(pTVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField.loc.filename._M_str + 4);
    local_38 = (pTVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.
               field_1.field_0.line;
    iStack_34 = (pTVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.
                field_1.field_0.first_column;
    iStack_30 = (pTVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.
                field_1.field_0.last_column;
    uStack_2c = *(undefined4 *)
                 ((long)&(pTVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField.loc.field_1 + 0xc);
    local_28 = (undefined4)
               ((ulong)((long)(this->types).
                              super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->types).
                             super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->type_bindings,
               (long)tVar2.
                     super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>
                     .super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl + 0x28);
  }
  local_48._M_head_impl =
       (TypeEntry *)
       tVar2.super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
       super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl;
  std::vector<wabt::TypeEntry*,std::allocator<wabt::TypeEntry*>>::emplace_back<wabt::TypeEntry*>
            ((vector<wabt::TypeEntry*,std::allocator<wabt::TypeEntry*>> *)&this->types,
             (TypeEntry **)&local_48);
  local_50._M_head_impl =
       (field->_M_t).
       super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>.
       _M_t.
       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
       super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl = (TypeModuleField *)0x0;
  intrusive_list<wabt::ModuleField>::push_back
            (&this->fields,
             (unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)&local_50);
  if (local_50._M_head_impl != (TypeModuleField *)0x0) {
    (*((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<TypeModuleField> field) {
  TypeEntry& type = *field->type;
  if (!type.name.empty()) {
    type_bindings.emplace(type.name, Binding(field->loc, types.size()));
  }
  types.push_back(&type);
  fields.push_back(std::move(field));
}